

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

void __thiscall
irr::core::string<unsigned_short>::reallocate(string<unsigned_short> *this,s32 new_size)

{
  unsigned_short *puVar1;
  uint uVar2;
  unsigned_short *puVar3;
  uint uVar4;
  ulong uVar5;
  
  puVar1 = this->array;
  uVar5 = 0xffffffffffffffff;
  if (-1 < new_size) {
    uVar5 = (ulong)(uint)new_size * 2;
  }
  puVar3 = (unsigned_short *)operator_new__(uVar5);
  this->array = puVar3;
  this->allocated = new_size;
  uVar2 = this->used;
  uVar4 = new_size;
  if ((int)uVar2 < new_size) {
    uVar4 = uVar2;
  }
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      this->array[uVar5] = puVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    new_size = this->allocated;
    uVar2 = this->used;
  }
  if (new_size < (int)uVar2) {
    this->used = new_size;
  }
  if (puVar1 != (unsigned_short *)0x0) {
    operator_delete__(puVar1);
    return;
  }
  return;
}

Assistant:

void reallocate(s32 new_size)
	{
		T* old_array = array;

		array = new T[new_size];
		allocated = new_size;
		
		s32 amount = used < new_size ? used : new_size;
		for (s32 i=0; i<amount; ++i)
			array[i] = old_array[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_array;
	}